

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Exa_ManAddCnf(Exa_Man_t_conflict *p,int iMint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint local_6c;
  int local_68;
  int nLits_1;
  int pLits_1 [4];
  int local_4c;
  int local_48;
  int nLits;
  int pLits [3];
  int iBaseSatVarJ;
  int iBaseSatVarI;
  int iVarStart;
  int Value;
  int j;
  int n;
  int k;
  int i;
  int iMint_local;
  Exa_Man_t_conflict *p_local;
  
  iVar2 = Abc_TtGetBit(p->pTruth,iMint);
  for (n = 0; n < p->nVars; n = n + 1) {
    p->VarVals[n] = iMint >> ((byte)n & 0x1f) & 1;
  }
  sat_solver_setnvars(p->pSat,p->iVar + p->nNodes * 3);
  n = p->nVars;
  do {
    if (p->nObjs <= n) {
      p->iVar = p->nNodes * 3 + p->iVar;
      return 1;
    }
    iVar1 = p->nVars;
    pLits[2] = p->iVar + (n - p->nVars) * 3;
    for (j = 0; j < 2; j = j + 1) {
      for (iVarStart = 0; iVarStart < p->nObjs; iVarStart = iVarStart + 1) {
        if (p->VarMarks[n][j][iVarStart] != 0) {
          pLits[1] = p->iVar + (iVarStart - p->nVars) * 3;
          for (Value = 0; Value < 2; Value = Value + 1) {
            local_48 = Abc_Var2Lit(p->VarMarks[n][j][iVarStart],1);
            nLits = Abc_Var2Lit(pLits[2] + j,Value);
            local_4c = 2;
            if (iVarStart < p->nVars) {
              if (p->VarVals[iVarStart] != Value) goto LAB_0070b74b;
            }
            else {
              pLits[0] = Abc_Var2Lit(pLits[1] + 2,(uint)((Value != 0 ^ 0xffU) & 1));
              local_4c = 3;
LAB_0070b74b:
              iVar3 = sat_solver_addclause(p->pSat,&local_48,&local_48 + local_4c);
              if (iVar3 == 0) {
                return 0;
              }
            }
          }
        }
      }
    }
    for (Value = 0; Value < 2; Value = Value + 1) {
      if ((n != p->nObjs + -1) || (Value != iVar2)) {
        for (j = 0; j < 4; j = j + 1) {
          if ((j != 0) || (Value != 1)) {
            local_68 = Abc_Var2Lit(pLits[2],j & 1);
            nLits_1 = Abc_Var2Lit(pLits[2] + 1,j >> 1);
            local_6c = 2;
            if (n != p->nObjs + -1) {
              pLits_1[0] = Abc_Var2Lit(pLits[2] + 2,(uint)((Value != 0 ^ 0xffU) & 1));
              local_6c = 3;
            }
            if (0 < j) {
              iVar3 = Abc_Var2Lit((n - iVar1) * 3 + j,Value);
              (&local_68)[(int)local_6c] = iVar3;
              local_6c = local_6c + 1;
            }
            if (4 < local_6c) {
              __assert_fail("nLits <= 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                            ,0x34b,"int Exa_ManAddCnf(Exa_Man_t *, int)");
            }
            iVar3 = sat_solver_addclause(p->pSat,&local_68,&local_68 + (int)local_6c);
            if (iVar3 == 0) {
              return 0;
            }
          }
        }
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

int Exa_ManAddCnf( Exa_Man_t * p, int iMint )
{
    // save minterm values
    int i, k, n, j, Value = Abc_TtGetBit(p->pTruth, iMint);
    for ( i = 0; i < p->nVars; i++ )
        p->VarVals[i] = (iMint >> i) & 1;
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar + 3*p->nNodes );
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // fanin connectivity
        int iVarStart = 1 + 3*(i - p->nVars);
        int iBaseSatVarI = p->iVar + 3*(i - p->nVars);
        for ( k = 0; k < 2; k++ )
        {
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            {
                int iBaseSatVarJ = p->iVar + 3*(j - p->nVars);
                for ( n = 0; n < 2; n++ )
                {
                    int pLits[3], nLits = 0;
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                    pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + k, n );
                    if ( j >= p->nVars )
                        pLits[nLits++] = Abc_Var2Lit( iBaseSatVarJ + 2, !n );
                    else if ( p->VarVals[j] == n )
                        continue;
                    if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                        return 0;
                }
            }
        }
        // node functionality
        for ( n = 0; n < 2; n++ )
        {
            if ( i == p->nObjs - 1 && n == Value )
                continue;
            for ( k = 0; k < 4; k++ )
            {
                int pLits[4], nLits = 0;
                if ( k == 0 && n == 1 )
                    continue;
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 0, (k&1)  );
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 1, (k>>1) );
                if ( i != p->nObjs - 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 2, !n );
                if ( k > 0 )             pLits[nLits++] = Abc_Var2Lit( iVarStart +  k-1,  n );
                assert( nLits <= 4 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                    return 0;
            }
        }
    }
    p->iVar += 3*p->nNodes;
    return 1;
}